

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluidSimulation.cpp
# Opt level: O2

void simuFluide2D(string *name,uint64_t Nx,uint64_t Ny,double tSimu,double nu,double rho,
                 double delta,double Lx,double Ly)

{
  undefined8 uVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  ostream *poVar5;
  iterator row;
  double dVar6;
  complex<double> *pcVar7;
  iterator puVar8;
  complex<double> *pcVar9;
  initializer_list<unsigned_long> *piVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  _func_int **pp_Var14;
  initializer_list<unsigned_long> *piVar15;
  initializer_list<unsigned_long> *piVar16;
  uint64_t j;
  uint64_t uVar17;
  iterator puVar18;
  uint64_t i;
  uint64_t uVar19;
  initializer_list<unsigned_long> *piVar20;
  initializer_list<unsigned_long> *piVar21;
  uint64_t uVar22;
  uint64_t j_1;
  double index;
  iterator index_00;
  bool bVar23;
  double dVar24;
  double dVar25;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  initializer_list<unsigned_long> *extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar32;
  initializer_list<unsigned_long> *piVar33;
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined4 uVar36;
  double dVar37;
  initializer_list<unsigned_long> local_2d8;
  undefined1 local_2c8 [24];
  double local_2b0;
  double local_2a8;
  initializer_list<unsigned_long> *local_2a0;
  thread saveThread;
  double t;
  Matrix<std::complex<double>_> WHat;
  Vector<std::complex<double>_> ky;
  initializer_list<unsigned_long> local_218;
  Matrix<std::complex<double>_> UxHat;
  undefined1 local_1c8 [16];
  initializer_list<unsigned_long> local_1b8;
  double local_1a8;
  double local_1a0;
  string *local_198;
  undefined1 *local_190;
  Vector<std::complex<double>_> kx;
  initializer_list<unsigned_long> local_128;
  Matrix<double> W;
  initializer_list<unsigned_long> local_e8;
  Matrix<std::complex<double>_> UyHat;
  iterator local_a0;
  double local_98;
  Matrix<double> Uy;
  Matrix<double> Ux;
  
  WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)0x0;
  local_2a8 = nu;
  local_198 = name;
  scp::Matrix<double>::Matrix(&Ux,Ny,Nx,(double *)&WHat);
  WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)0x0;
  scp::Matrix<double>::Matrix(&Uy,Ny,Nx,(double *)&WHat);
  scp::Matrix<double>::Matrix(&W,Ny,Nx);
  uVar36 = SUB164(ZEXT816(0x4530000043300000),4);
  auVar26._8_4_ = (int)(Nx >> 0x20);
  auVar26._0_8_ = Nx;
  auVar26._12_4_ = uVar36;
  uVar35 = SUB164(ZEXT816(0x4530000043300000),0);
  dVar37 = (auVar26._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(uVar35,(int)Nx) - 4503599627370496.0);
  local_1a0 = Lx / dVar37;
  auVar27._8_4_ = (int)(Ny >> 0x20);
  auVar27._0_8_ = Ny;
  auVar27._12_4_ = uVar36;
  dVar32 = (auVar27._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(uVar35,(int)Ny) - 4503599627370496.0);
  local_1a8 = Ly / dVar32;
  local_2a8 = local_2a8 / rho;
  uVar22 = 0;
  for (uVar19 = 0; uVar19 != Ny; uVar19 = uVar19 + 1) {
    auVar28._8_4_ = (int)(uVar19 >> 0x20);
    auVar28._0_8_ = uVar19;
    auVar28._12_4_ = 0x45300000;
    dVar31 = auVar28._8_8_ - 1.9342813113834067e+25;
    local_2c8._0_8_ =
         (dVar31 + ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0) + 0.5) / dVar32;
    local_2c8._8_8_ = dVar31;
    dVar31 = ((double)local_2c8._0_8_ + -0.25) * rho;
    local_2a0 = (initializer_list<unsigned_long> *)((0.75 - (double)local_2c8._0_8_) * rho);
    for (uVar17 = 0; Nx != uVar17; uVar17 = uVar17 + 1) {
      auVar34._8_4_ = (int)(uVar17 >> 0x20);
      auVar34._0_8_ = uVar17;
      auVar34._12_4_ = 0x45300000;
      dVar24 = cos((((auVar34._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0) + 0.5) / dVar37
                   ) * 6.283185307179586);
      dVar24 = dVar24 * delta * 6.283185307179586;
      if ((double)local_2c8._0_8_ <= 0.5) {
        local_2b0 = cosh(dVar31);
        dVar25 = cosh(dVar31);
        dVar24 = dVar24 - rho / (dVar25 * local_2b0);
      }
      else {
        local_2b0 = cosh((double)local_2a0);
        dVar25 = cosh((double)local_2a0);
        dVar24 = dVar24 + rho / (dVar25 * local_2b0);
      }
      pdVar4 = scp::Tensor<double>::operator[](&W.super_Tensor<double>,uVar22 + uVar17);
      *pdVar4 = dVar24;
    }
    uVar22 = uVar22 + uVar17;
  }
  t = 0.0;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&WHat,local_198,auto_format);
  simanim::createAnimation((path *)&WHat,Nx,Ny);
  std::filesystem::__cxx11::path::~path((path *)&WHat);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&WHat,local_198,auto_format);
  kx.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&W;
  std::thread::
  thread<void(&)(std::filesystem::__cxx11::path_const&,double,scp::Matrix<double>const&),std::filesystem::__cxx11::path,double&,std::reference_wrapper<scp::Matrix<double>>,void>
            (&saveThread,simanim::saveAnimationFrame,(path *)&WHat,&t,
             (reference_wrapper<scp::Matrix<double>_> *)&kx);
  std::filesystem::__cxx11::path::~path((path *)&WHat);
  dVar32 = local_2a8 + local_2a8;
  local_2b0 = local_1a0 * local_1a0;
  dVar37 = local_1a8 * local_1a8;
  do {
    dVar31 = 0.0;
    if (tSimu <= t) {
      std::thread::join();
      std::thread::~thread(&saveThread);
      scp::Tensor<double>::~Tensor(&W.super_Tensor<double>);
      scp::Tensor<double>::~Tensor(&Uy.super_Tensor<double>);
      scp::Tensor<double>::~Tensor(&Ux.super_Tensor<double>);
      return;
    }
    piVar10 = (initializer_list<unsigned_long> *)t;
    poVar5 = std::operator<<((ostream *)&std::cout,"> Iteration ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5," a t=");
    poVar5 = std::ostream::_M_insert<double>(t);
    std::endl<char,std::char_traits<char>>(poVar5);
    dVar25 = (double)scp::Tensor<double>::getSize(&W.super_Tensor<double>,1);
    row = (iterator)scp::Tensor<double>::getSize(&W.super_Tensor<double>,0);
    scp::Matrix<std::complex<double>_>::Matrix
              ((Matrix<std::complex<double>_> *)&WHat.super_Tensor<std::complex<double>_>,
               (uint64_t)row,(uint64_t)dVar25);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::complex<double>*>
              (W.super_Tensor<double>._values,
               W.super_Tensor<double>._values + W.super_Tensor<double>._length,
               WHat.super_Tensor<std::complex<double>_>._values);
    scp::Tensor<std::complex<double>_>::fft(&WHat.super_Tensor<std::complex<double>_>);
    scp::Vector<std::complex<double>_>::Vector
              ((Vector<std::complex<double>_> *)&kx.super_Tensor<std::complex<double>_>,
               (uint64_t)dVar25);
    scp::Vector<std::complex<double>_>::Vector(&ky,(uint64_t)row);
    index = 0.0;
    dVar24 = dVar25;
    while (dVar24 != 0.0) {
      dVar6 = dVar24;
      if ((ulong)index < (long)dVar25 + 1U >> 1) {
        dVar6 = index;
      }
      auVar29._8_4_ = (int)((ulong)dVar6 >> 0x20);
      auVar29._0_8_ = dVar6;
      auVar29._12_4_ = 0x45300000;
      dVar31 = auVar29._8_8_ - 1.9342813113834067e+25;
      piVar33 = (initializer_list<unsigned_long> *)
                (((dVar31 + ((double)CONCAT44(0x43300000,SUB84(dVar6,0)) - 4503599627370496.0)) *
                 6.283185307179586) / Lx);
      piVar10 = piVar33;
      pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                         (&kx.super_Tensor<std::complex<double>_>,(uint64_t)index);
      *(undefined8 *)pcVar7->_M_value = 0;
      *(initializer_list<unsigned_long> **)(pcVar7->_M_value + 8) = piVar33;
      index = (double)((long)index + 1);
      dVar24 = (double)((long)dVar24 - 1);
    }
    index_00 = (iterator)0x0;
    puVar18 = row;
    while (puVar18 != (iterator)0x0) {
      puVar8 = puVar18;
      if (index_00 < (iterator)((ulong)((long)row + 1U) >> 1)) {
        puVar8 = index_00;
      }
      auVar30._8_4_ = (int)((ulong)puVar8 >> 0x20);
      auVar30._0_8_ = puVar8;
      auVar30._12_4_ = 0x45300000;
      dVar31 = auVar30._8_8_ - 1.9342813113834067e+25;
      piVar33 = (initializer_list<unsigned_long> *)
                (((dVar31 + ((double)CONCAT44(0x43300000,(int)puVar8) - 4503599627370496.0)) *
                 6.283185307179586) / Ly);
      piVar10 = piVar33;
      pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                         (&ky.super_Tensor<std::complex<double>_>,(uint64_t)index_00);
      *(undefined8 *)pcVar7->_M_value = 0;
      *(initializer_list<unsigned_long> **)(pcVar7->_M_value + 8) = piVar33;
      index_00 = (iterator)((long)index_00 + 1);
      puVar18 = (iterator)((long)puVar18 - 1);
    }
    scp::Matrix<std::complex<double>_>::Matrix(&UxHat,(uint64_t)row,(uint64_t)dVar25);
    scp::Matrix<std::complex<double>_>::Matrix(&UyHat,(uint64_t)row,(uint64_t)dVar25);
    for (puVar18 = (iterator)0x0; puVar18 != row; puVar18 = (iterator)((long)puVar18 + 1)) {
      for (dVar24 = 0.0; dVar25 != dVar24; dVar24 = (double)((long)dVar24 + 1)) {
        if (dVar24 == 0.0 && puVar18 == (iterator)0x0) {
          local_218._M_array = (iterator)0x0;
          local_218._M_len = 0;
          local_2d8._M_len = 2;
          local_2d8._M_array = (iterator)&local_218;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&UxHat.super_Tensor<std::complex<double>_>,&local_2d8);
          *(undefined8 *)pcVar7->_M_value = 0;
          *(undefined8 *)(pcVar7->_M_value + 8) = 0;
          local_218._M_array = (iterator)0x0;
          local_218._M_len = 0;
          local_2d8._M_len = 2;
          local_2d8._M_array = (iterator)&local_218;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&UyHat.super_Tensor<std::complex<double>_>,&local_2d8);
          *(undefined8 *)pcVar7->_M_value = 0;
          *(undefined8 *)(pcVar7->_M_value + 8) = 0;
        }
        else {
          local_1b8._M_array = (iterator)local_1c8;
          local_1b8._M_len = 2;
          local_1c8._0_8_ = puVar18;
          local_1c8._8_8_ = dVar24;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&WHat.super_Tensor<std::complex<double>_>,&local_1b8);
          local_218._M_array = (iterator)(*(ulong *)pcVar7->_M_value ^ 0x8000000000000000);
          local_218._M_len = *(ulong *)(pcVar7->_M_value + 8) ^ 0x8000000000000000;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&ky.super_Tensor<std::complex<double>_>,(uint64_t)puVar18);
          std::operator*((complex<double> *)&local_218,pcVar7);
          local_2d8._M_len = (size_type)piVar10;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&kx.super_Tensor<std::complex<double>_>,(uint64_t)dVar24);
          pcVar9 = scp::Tensor<std::complex<double>_>::operator[]
                             (&kx.super_Tensor<std::complex<double>_>,(uint64_t)dVar24);
          std::operator*(pcVar7,pcVar9);
          local_2c8._0_8_ = piVar10;
          local_2c8._8_8_ = dVar31;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&ky.super_Tensor<std::complex<double>_>,(uint64_t)puVar18);
          pcVar9 = scp::Tensor<std::complex<double>_>::operator[]
                             (&ky.super_Tensor<std::complex<double>_>,(uint64_t)puVar18);
          std::operator*(pcVar7,pcVar9);
          local_e8._M_array = (iterator)(extraout_XMM0_Qa_00 + extraout_XMM0_Qa);
          local_e8._M_len = (size_type)((double)piVar10 + (double)local_2c8._0_8_);
          std::operator/((complex<double> *)&local_2d8,(complex<double> *)&local_e8);
          local_128._M_array = (iterator)&local_a0;
          local_128._M_len = 2;
          local_a0 = puVar18;
          local_98 = dVar24;
          local_2c8._0_8_ = piVar10;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&UxHat.super_Tensor<std::complex<double>_>,&local_128);
          *(undefined8 *)pcVar7->_M_value = extraout_XMM0_Qa_01;
          *(undefined8 *)(pcVar7->_M_value + 8) = local_2c8._0_8_;
          local_218._M_array = (iterator)&local_1b8;
          local_218._M_len = 2;
          local_1b8._M_array = puVar18;
          local_1b8._M_len = (size_type)dVar24;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&WHat.super_Tensor<std::complex<double>_>,&local_218);
          pcVar9 = scp::Tensor<std::complex<double>_>::operator[]
                             (&kx.super_Tensor<std::complex<double>_>,(uint64_t)dVar24);
          std::operator*(pcVar7,pcVar9);
          local_2d8._M_array = (iterator)extraout_XMM0_Qa_02;
          local_2d8._M_len = (size_type)piVar10;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&kx.super_Tensor<std::complex<double>_>,(uint64_t)dVar24);
          pcVar9 = scp::Tensor<std::complex<double>_>::operator[]
                             (&kx.super_Tensor<std::complex<double>_>,(uint64_t)dVar24);
          std::operator*(pcVar7,pcVar9);
          local_2c8._0_8_ = piVar10;
          local_2c8._8_8_ = dVar31;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&ky.super_Tensor<std::complex<double>_>,(uint64_t)puVar18);
          pcVar9 = scp::Tensor<std::complex<double>_>::operator[]
                             (&ky.super_Tensor<std::complex<double>_>,(uint64_t)puVar18);
          std::operator*(pcVar7,pcVar9);
          local_1c8._0_8_ = extraout_XMM0_Qa_04 + extraout_XMM0_Qa_03;
          local_1c8._8_8_ = (double)piVar10 + (double)local_2c8._0_8_;
          std::operator/((complex<double> *)&local_2d8,(complex<double> *)local_1c8);
          local_2c8._0_8_ = piVar10;
          local_e8._M_array = (iterator)&local_128;
          local_e8._M_len = 2;
          local_128._M_array = puVar18;
          local_128._M_len = (size_type)dVar24;
          pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                             (&UyHat.super_Tensor<std::complex<double>_>,&local_e8);
          *(undefined8 *)pcVar7->_M_value = extraout_XMM0_Qa_05;
          *(undefined8 *)(pcVar7->_M_value + 8) = local_2c8._0_8_;
        }
      }
    }
    scp::Tensor<std::complex<double>_>::ifft(&UxHat.super_Tensor<std::complex<double>_>);
    scp::Tensor<std::complex<double>_>::ifft(&UyHat.super_Tensor<std::complex<double>_>);
    puVar18 = (iterator)0x0;
    while( true ) {
      local_2c8._0_8_ = puVar18;
      if (puVar18 == row) break;
      dVar31 = 0.0;
      while( true ) {
        uVar1 = local_2c8._0_8_;
        if (dVar25 == dVar31) break;
        local_218._M_array = (iterator)local_2c8._0_8_;
        local_2d8._M_len = 2;
        local_2d8._M_array = (iterator)&local_218;
        local_218._M_len = (size_type)dVar31;
        pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                           (&UxHat.super_Tensor<std::complex<double>_>,&local_2d8);
        dVar24 = *(double *)(pcVar7->_M_value + 8);
        local_1c8._0_8_ = uVar1;
        local_1b8._M_array = (iterator)local_1c8;
        local_1b8._M_len = 2;
        local_1c8._8_8_ = dVar31;
        pdVar4 = scp::Tensor<double>::operator[](&Ux.super_Tensor<double>,&local_1b8);
        *pdVar4 = dVar24;
        local_218._M_array = (iterator)uVar1;
        local_2d8._M_len = 2;
        local_2d8._M_array = (iterator)&local_218;
        local_218._M_len = (size_type)dVar31;
        pcVar7 = scp::Tensor<std::complex<double>_>::operator[]
                           (&UyHat.super_Tensor<std::complex<double>_>,&local_2d8);
        dVar24 = *(double *)(pcVar7->_M_value + 8);
        local_1c8._0_8_ = uVar1;
        local_1b8._M_array = (iterator)local_1c8;
        local_1b8._M_len = 2;
        local_1c8._8_8_ = dVar31;
        pdVar4 = scp::Tensor<double>::operator[](&Uy.super_Tensor<double>,&local_1b8);
        *pdVar4 = dVar24;
        dVar31 = (double)((long)dVar31 + 1);
      }
      puVar18 = (iterator)((long)(iterator *)local_2c8._0_8_ + 1);
    }
    scp::Tensor<std::complex<double>_>::~Tensor(&UyHat.super_Tensor<std::complex<double>_>);
    scp::Tensor<std::complex<double>_>::~Tensor(&UxHat.super_Tensor<std::complex<double>_>);
    scp::Tensor<std::complex<double>_>::~Tensor(&ky.super_Tensor<std::complex<double>_>);
    scp::Tensor<std::complex<double>_>::~Tensor(&kx.super_Tensor<std::complex<double>_>);
    scp::Tensor<std::complex<double>_>::~Tensor(&WHat.super_Tensor<std::complex<double>_>);
    pdVar4 = Ux.super_Tensor<double>._values;
    if (Ux.super_Tensor<double>._length != 0) {
      lVar12 = Ux.super_Tensor<double>._length * 8;
      pdVar2 = Ux.super_Tensor<double>._values;
      pdVar11 = Ux.super_Tensor<double>._values;
      while( true ) {
        pdVar4 = pdVar2;
        lVar12 = lVar12 + -8;
        pdVar11 = pdVar11 + 1;
        if (lVar12 == 0) break;
        pdVar2 = pdVar11;
        if (ABS(*pdVar11) <= ABS(*pdVar4)) {
          pdVar2 = pdVar4;
        }
      }
    }
    dVar31 = *pdVar4;
    pdVar4 = Uy.super_Tensor<double>._values;
    if (Uy.super_Tensor<double>._length != 0) {
      lVar12 = Uy.super_Tensor<double>._length * 8;
      pdVar2 = Uy.super_Tensor<double>._values;
      pdVar11 = Uy.super_Tensor<double>._values;
      while( true ) {
        pdVar4 = pdVar2;
        lVar12 = lVar12 + -8;
        pdVar11 = pdVar11 + 1;
        if (lVar12 == 0) break;
        pdVar2 = pdVar11;
        if (ABS(*pdVar11) <= ABS(*pdVar4)) {
          pdVar2 = pdVar4;
        }
      }
    }
    dVar24 = *pdVar4;
    std::thread::join();
    piVar10 = (initializer_list<unsigned_long> *)
              scp::Tensor<double>::getSize(&W.super_Tensor<double>,1);
    piVar33 = (initializer_list<unsigned_long> *)
              scp::Tensor<double>::getSize(&W.super_Tensor<double>,0);
    if (((anonymous_namespace)::
         curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
         ::Kx == '\0') &&
       (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                     ::Kx), iVar3 != 0)) {
      WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)0x0;
      scp::Matrix<double>::Matrix
                ((Matrix<double> *)
                 (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::Kx,(uint64_t)piVar10,(uint64_t)piVar10,(double *)&WHat);
      __cxa_atexit(scp::Tensor<double>::~Tensor,
                   (anonymous_namespace)::
                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                   ::Kx,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                           ::Kx);
    }
    if (((anonymous_namespace)::
         curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
         ::Ky == '\0') &&
       (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                     ::Ky), iVar3 != 0)) {
      WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)0x0;
      scp::Matrix<double>::Matrix
                ((Matrix<double> *)
                 (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::Ky,(uint64_t)piVar33,(uint64_t)piVar33,(double *)&WHat);
      __cxa_atexit(scp::Tensor<double>::~Tensor,
                   (anonymous_namespace)::
                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                   ::Ky,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                           ::Ky);
    }
    dVar25 = local_1a8 / ABS(dVar24);
    if (local_1a0 / ABS(dVar31) <= local_1a8 / ABS(dVar24)) {
      dVar25 = local_1a0 / ABS(dVar31);
    }
    if (dVar25 <= (anonymous_namespace)::
                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                  ::dtUsed * 1.2) {
      bVar23 = false;
      for (; dVar25 < (anonymous_namespace)::
                      curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                      ::dtUsed;
          (anonymous_namespace)::
          curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
          ::dtUsed = (anonymous_namespace)::
                     curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                     ::dtUsed / 1.2) {
        bVar23 = true;
      }
      if (bVar23) goto LAB_001064e1;
    }
    else {
      (anonymous_namespace)::
      curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
      ::dtUsed = (double)(~-(ulong)((anonymous_namespace)::
                                    curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                    ::dtUsed == 0.0) &
                          (ulong)((anonymous_namespace)::
                                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                  ::dtUsed * 1.2) |
                         (ulong)dVar25 &
                         -(ulong)((anonymous_namespace)::
                                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                  ::dtUsed == 0.0));
LAB_001064e1:
      piVar15 = piVar10;
      piVar16 = (initializer_list<unsigned_long> *)0x0;
      while (bVar23 = piVar15 != (initializer_list<unsigned_long> *)0x0,
            piVar15 = (initializer_list<unsigned_long> *)((long)&piVar15[-1]._M_len + 7), bVar23) {
        dVar31 = ((anonymous_namespace)::
                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                  ::dtUsed * dVar32) / local_2b0;
        WHat.super_Tensor<std::complex<double>_>._shape.order = 2;
        WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&kx;
        kx.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar16;
        kx.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar16;
        pdVar4 = scp::Tensor<double>::operator[]
                           ((Tensor<double> *)
                            (anonymous_namespace)::
                            curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                            ::Kx,(initializer_list<unsigned_long> *)&WHat);
        *pdVar4 = dVar31 + 1.0;
        dVar31 = (-(anonymous_namespace)::
                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                   ::dtUsed * local_2a8) / local_2b0;
        piVar21 = (initializer_list<unsigned_long> *)((long)&piVar16->_M_array + 1);
        piVar20 = (initializer_list<unsigned_long> *)0x0;
        if (piVar21 != piVar10) {
          piVar20 = piVar21;
        }
        WHat.super_Tensor<std::complex<double>_>._shape.order = 2;
        WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&kx;
        kx.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar20;
        kx.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar16;
        pdVar4 = scp::Tensor<double>::operator[]
                           ((Tensor<double> *)
                            (anonymous_namespace)::
                            curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                            ::Kx,(initializer_list<unsigned_long> *)&WHat);
        *pdVar4 = dVar31;
        dVar31 = (-(anonymous_namespace)::
                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                   ::dtUsed * local_2a8) / local_2b0;
        WHat.super_Tensor<std::complex<double>_>._shape.order = 2;
        WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&kx;
        kx.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar16;
        kx.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar20;
        pdVar4 = scp::Tensor<double>::operator[]
                           ((Tensor<double> *)
                            (anonymous_namespace)::
                            curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                            ::Kx,(initializer_list<unsigned_long> *)&WHat);
        *pdVar4 = dVar31;
        piVar16 = piVar21;
      }
      scp::Matrix<double>::inverse
                ((Matrix<double> *)
                 (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::Kx);
      piVar15 = piVar33;
      piVar16 = (initializer_list<unsigned_long> *)0x0;
      while (bVar23 = piVar15 != (initializer_list<unsigned_long> *)0x0,
            piVar15 = (initializer_list<unsigned_long> *)((long)&piVar15[-1]._M_len + 7), bVar23) {
        dVar31 = (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::dtUsed * dVar32;
        WHat.super_Tensor<std::complex<double>_>._shape.order = 2;
        WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&kx;
        kx.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar16;
        kx.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar16;
        pdVar4 = scp::Tensor<double>::operator[]
                           ((Tensor<double> *)
                            (anonymous_namespace)::
                            curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                            ::Ky,(initializer_list<unsigned_long> *)&WHat);
        *pdVar4 = dVar31 / dVar37 + 1.0;
        dVar31 = -(anonymous_namespace)::
                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                  ::dtUsed * local_2a8;
        piVar21 = (initializer_list<unsigned_long> *)((long)&piVar16->_M_array + 1);
        piVar20 = (initializer_list<unsigned_long> *)0x0;
        if (piVar21 != piVar33) {
          piVar20 = piVar21;
        }
        WHat.super_Tensor<std::complex<double>_>._shape.order = 2;
        WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&kx;
        kx.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar20;
        kx.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar16;
        pdVar4 = scp::Tensor<double>::operator[]
                           ((Tensor<double> *)
                            (anonymous_namespace)::
                            curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                            ::Ky,(initializer_list<unsigned_long> *)&WHat);
        *pdVar4 = dVar31 / dVar37;
        dVar31 = -(anonymous_namespace)::
                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                  ::dtUsed * local_2a8;
        WHat.super_Tensor<std::complex<double>_>._shape.order = 2;
        WHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&kx;
        kx.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar16;
        kx.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar20;
        pdVar4 = scp::Tensor<double>::operator[]
                           ((Tensor<double> *)
                            (anonymous_namespace)::
                            curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                            ::Ky,(initializer_list<unsigned_long> *)&WHat);
        *pdVar4 = dVar31 / dVar37;
        piVar16 = piVar21;
      }
      scp::Matrix<double>::inverse
                ((Matrix<double> *)
                 (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::Ky);
    }
    scp::Vector<double>::Vector((Vector<double> *)&WHat,(uint64_t)piVar10);
    scp::Vector<double>::Vector((Vector<double> *)&kx,(uint64_t)piVar10);
    local_190 = (undefined1 *)((long)&piVar10[-1]._M_len + 7);
    for (piVar15 = (initializer_list<unsigned_long> *)0x0; piVar15 != piVar33;
        piVar15 = (initializer_list<unsigned_long> *)((long)&piVar15->_M_array + 1)) {
      local_2c8._0_8_ = local_190;
      piVar16 = piVar10;
      piVar21 = (initializer_list<unsigned_long> *)0x0;
      while (bVar23 = piVar16 != (initializer_list<unsigned_long> *)0x0,
            piVar16 = (initializer_list<unsigned_long> *)((long)&piVar16[-1]._M_len + 7), bVar23) {
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar15;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar21;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&Ux.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        dVar24 = (*pdVar4 *
                 (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::dtUsed) / local_1a0;
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar15;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar21;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&W.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        dVar31 = *pdVar4;
        local_2a0 = (initializer_list<unsigned_long> *)((long)&piVar21->_M_array + 1);
        local_2d8._M_len = (size_type)local_2a0;
        if (local_2a0 == piVar10) {
          local_2d8._M_len = 0;
        }
        UyHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&local_2d8;
        UyHat.super_Tensor<std::complex<double>_>._shape.order = 2;
        local_2d8._M_array = (iterator)piVar15;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&W.super_Tensor<double>,(initializer_list<unsigned_long> *)&UyHat);
        dVar25 = *pdVar4;
        pdVar4 = scp::Tensor<double>::operator[]((Tensor<double> *)&WHat,(uint64_t)piVar21);
        *pdVar4 = (dVar24 + -1.0) * dVar24 * 0.5 * dVar25 + (1.0 - dVar24 * dVar24) * dVar31;
        uVar1 = local_2c8._0_8_;
        uVar13 = (ulong)local_2c8._0_8_ % (ulong)piVar10;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar15;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = uVar13;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&Ux.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        dVar24 = (*pdVar4 *
                 (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::dtUsed) / local_1a0;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar15;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = uVar13;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&W.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        dVar31 = *pdVar4;
        pdVar4 = scp::Tensor<double>::operator[]((Tensor<double> *)&WHat,(uint64_t)piVar21);
        *pdVar4 = (dVar24 + 1.0) * dVar24 * 0.5 * dVar31 + *pdVar4;
        local_2c8._0_8_ = uVar1 + 1;
        piVar21 = local_2a0;
      }
      scp::operator*((Vector<double> *)&ky,
                     (Matrix<double> *)
                     (anonymous_namespace)::
                     curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                     ::Kx,(Vector<double> *)&WHat);
      scp::Tensor<double>::operator=((Tensor<double> *)&WHat,(Tensor<double> *)&ky);
      scp::Tensor<double>::~Tensor((Tensor<double> *)&ky);
      for (piVar16 = (initializer_list<unsigned_long> *)0x0; piVar10 != piVar16;
          piVar16 = (initializer_list<unsigned_long> *)((long)&piVar16->_M_array + 1)) {
        pdVar4 = scp::Tensor<double>::operator[]((Tensor<double> *)&WHat,(uint64_t)piVar16);
        dVar31 = *pdVar4;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar15;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar16;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&W.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        *pdVar4 = dVar31;
      }
    }
    scp::Tensor<double>::~Tensor((Tensor<double> *)&kx);
    scp::Tensor<double>::~Tensor((Tensor<double> *)&WHat);
    scp::Vector<double>::Vector((Vector<double> *)&WHat,(uint64_t)piVar33);
    scp::Vector<double>::Vector((Vector<double> *)&kx,(uint64_t)piVar33);
    local_190 = (undefined1 *)((long)&piVar33[-1]._M_len + 7);
    piVar15 = (initializer_list<unsigned_long> *)0x0;
    while( true ) {
      if (piVar15 == piVar10) break;
      local_2c8._0_8_ = local_190;
      piVar16 = (initializer_list<unsigned_long> *)0x0;
      piVar21 = piVar33;
      while (bVar23 = piVar21 != (initializer_list<unsigned_long> *)0x0,
            piVar21 = (initializer_list<unsigned_long> *)((long)&piVar21[-1]._M_len + 7), bVar23) {
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar16;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar15;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&Uy.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        dVar24 = (*pdVar4 *
                 (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::dtUsed) / local_1a8;
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar16;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar15;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&W.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        dVar31 = *pdVar4;
        local_2a0 = (initializer_list<unsigned_long> *)((long)&piVar16->_M_array + 1);
        local_2d8._M_array = (iterator)local_2a0;
        if (local_2a0 == piVar33) {
          local_2d8._M_array = (iterator)0x0;
        }
        UyHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&local_2d8;
        UyHat.super_Tensor<std::complex<double>_>._shape.order = 2;
        local_2d8._M_len = (size_type)piVar15;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&W.super_Tensor<double>,(initializer_list<unsigned_long> *)&UyHat);
        dVar25 = *pdVar4;
        pdVar4 = scp::Tensor<double>::operator[]((Tensor<double> *)&WHat,(uint64_t)piVar16);
        *pdVar4 = (dVar24 + -1.0) * dVar24 * 0.5 * dVar25 + (1.0 - dVar24 * dVar24) * dVar31;
        uVar1 = local_2c8._0_8_;
        pp_Var14 = (_func_int **)((ulong)local_2c8._0_8_ % (ulong)piVar33);
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = pp_Var14;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar15;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&Uy.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        dVar24 = (*pdVar4 *
                 (anonymous_namespace)::
                 curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                 ::dtUsed) / local_1a8;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = pp_Var14;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar15;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&W.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        dVar31 = *pdVar4;
        pdVar4 = scp::Tensor<double>::operator[]((Tensor<double> *)&WHat,(uint64_t)piVar16);
        *pdVar4 = (dVar24 + 1.0) * dVar24 * 0.5 * dVar31 + *pdVar4;
        local_2c8._0_8_ = uVar1 + 1;
        piVar16 = local_2a0;
      }
      scp::operator*((Vector<double> *)&ky,
                     (Matrix<double> *)
                     (anonymous_namespace)::
                     curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                     ::Ky,(Vector<double> *)&WHat);
      scp::Tensor<double>::operator=((Tensor<double> *)&WHat,(Tensor<double> *)&ky);
      scp::Tensor<double>::~Tensor((Tensor<double> *)&ky);
      for (piVar16 = (initializer_list<unsigned_long> *)0x0; piVar33 != piVar16;
          piVar16 = (initializer_list<unsigned_long> *)((long)&piVar16->_M_array + 1)) {
        pdVar4 = scp::Tensor<double>::operator[]((Tensor<double> *)&WHat,(uint64_t)piVar16);
        dVar31 = *pdVar4;
        ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&UxHat;
        ky.super_Tensor<std::complex<double>_>._shape.order = 2;
        UxHat.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)piVar16;
        UxHat.super_Tensor<std::complex<double>_>._shape.order = (uint64_t)piVar15;
        pdVar4 = scp::Tensor<double>::operator[]
                           (&W.super_Tensor<double>,(initializer_list<unsigned_long> *)&ky);
        *pdVar4 = dVar31;
      }
      piVar15 = (initializer_list<unsigned_long> *)((long)&piVar15->_M_array + 1);
    }
    scp::Tensor<double>::~Tensor((Tensor<double> *)&kx);
    scp::Tensor<double>::~Tensor((Tensor<double> *)&WHat);
    dVar31 = (anonymous_namespace)::
             curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
             ::dtUsed;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&WHat,local_198,auto_format);
    ky.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)&W;
    std::thread::
    thread<void(&)(std::filesystem::__cxx11::path_const&,double,scp::Matrix<double>const&),std::filesystem::__cxx11::path,double&,std::reference_wrapper<scp::Matrix<double>>,void>
              ((thread *)&kx,simanim::saveAnimationFrame,(path *)&WHat,&t,
               (reference_wrapper<scp::Matrix<double>_> *)&ky);
    if (saveThread._M_id._M_thread != 0) {
      std::terminate();
    }
    saveThread._M_id._M_thread = (id)(id)kx.super_Tensor<std::complex<double>_>._vptr_Tensor;
    kx.super_Tensor<std::complex<double>_>._vptr_Tensor = (_func_int **)0x0;
    std::thread::~thread((thread *)&kx);
    std::filesystem::__cxx11::path::~path((path *)&WHat);
    t = dVar31 + t;
  } while( true );
}

Assistant:

void simuFluide2D(const std::string& name, uint64_t Nx, uint64_t Ny, double tSimu, double nu, double rho, double delta, double Lx, double Ly)
{
	double dx = Lx / Nx;
	double dy = Ly / Ny;
	double kappa = nu / rho;
	scp::Matrix<double> Ux(Ny, Nx, 0.0);
	scp::Matrix<double> Uy(Ny, Nx, 0.0);
	scp::Matrix<double> W(Ny, Nx);

	for (uint64_t i = 0, n = 0; i < Ny; ++i)
	{
		for (uint64_t j = 0; j < Nx; ++j, ++n)
		{
			W[n] = wInit((j + 0.5) / Nx, (i + 0.5) / Ny, delta, rho);
		}
	}

	double t(0), dtx, dty, dt;
	uint64_t iterations = 0;

	simanim::createAnimation(name, Nx, Ny);
	std::thread saveThread(simanim::saveAnimationFrame, fs::path(name), t, std::ref(W));
	while (t < tSimu)
	{
		iterations++;
		std::cout << "> Iteration " << iterations << " a t=" << t << std::endl;

		velocityFromCurl(W, Ux, Uy, Lx, Ly);

		dtx = dx / std::abs(*std::max_element(Ux.begin(), Ux.end(), [](double x, double y) { return std::abs(x) < std::abs(y); }));
		dty = dy / std::abs(*std::max_element(Uy.begin(), Uy.end(), [](double x, double y) { return std::abs(x) < std::abs(y); }));
		dt = std::min(dtx, dty);

		saveThread.join();
		dt = curl2D(W, Ux, Uy, kappa, dx, dy, dt);
		saveThread = std::thread(simanim::saveAnimationFrame, fs::path(name), t, std::ref(W));

		t += dt;
	}

	saveThread.join();
}